

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_gen_inv_stage_range
               (int8_t *stage_range_col,int8_t *stage_range_row,TXFM_2D_FLIP_CFG *cfg,
               TX_SIZE tx_size,int bd)

{
  int real_range_col;
  int i_1;
  int real_range_row;
  int i;
  int8_t opt_range_col;
  int8_t opt_range_row;
  int8_t *shift;
  int fwd_shift;
  int bd_local;
  TX_SIZE tx_size_local;
  TXFM_2D_FLIP_CFG *cfg_local;
  int8_t *stage_range_row_local;
  int8_t *stage_range_col_local;
  
  if (bd == 8) {
    opt_range_row = '\x10';
    opt_range_col = '\x10';
  }
  else if (bd == 10) {
    opt_range_row = '\x12';
    opt_range_col = '\x10';
  }
  else {
    opt_range_row = '\x14';
    opt_range_col = '\x12';
  }
  for (i = 0; i < cfg->stage_num_row && i < 0xc; i = i + 1) {
    if ((cfg->txfm_type_row == '\x05') && (i == 1)) {
      stage_range_row[1] = opt_range_row;
    }
    else {
      stage_range_row[i] = opt_range_row;
    }
  }
  for (i_1 = 0; i_1 < cfg->stage_num_col && i_1 < 0xc; i_1 = i_1 + 1) {
    if ((cfg->txfm_type_col == '\x05') && (i_1 == 1)) {
      stage_range_col[1] = opt_range_col;
    }
    else {
      stage_range_col[i_1] = opt_range_col;
    }
  }
  return;
}

Assistant:

void av1_gen_inv_stage_range(int8_t *stage_range_col, int8_t *stage_range_row,
                             const TXFM_2D_FLIP_CFG *cfg, TX_SIZE tx_size,
                             int bd) {
  const int fwd_shift = inv_start_range[tx_size];
  const int8_t *shift = cfg->shift;
  int8_t opt_range_row, opt_range_col;
  if (bd == 8) {
    opt_range_row = 16;
    opt_range_col = 16;
  } else if (bd == 10) {
    opt_range_row = 18;
    opt_range_col = 16;
  } else {
    assert(bd == 12);
    opt_range_row = 20;
    opt_range_col = 18;
  }
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_row && i < MAX_TXFM_STAGE_NUM; ++i) {
    int real_range_row = cfg->stage_range_row[i] + fwd_shift + bd + 1;
    (void)real_range_row;
    if (cfg->txfm_type_row == TXFM_TYPE_ADST4 && i == 1) {
      // the adst4 may use 1 extra bit on top of opt_range_row at stage 1
      // so opt_range_row >= real_range_row will not hold
      stage_range_row[i] = opt_range_row;
    } else {
      assert(opt_range_row >= real_range_row);
      stage_range_row[i] = opt_range_row;
    }
  }
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_col && i < MAX_TXFM_STAGE_NUM; ++i) {
    int real_range_col =
        cfg->stage_range_col[i] + fwd_shift + shift[0] + bd + 1;
    (void)real_range_col;
    if (cfg->txfm_type_col == TXFM_TYPE_ADST4 && i == 1) {
      // the adst4 may use 1 extra bit on top of opt_range_col at stage 1
      // so opt_range_col >= real_range_col will not hold
      stage_range_col[i] = opt_range_col;
    } else {
      assert(opt_range_col >= real_range_col);
      stage_range_col[i] = opt_range_col;
    }
  }
}